

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  size_type *psVar1;
  TestResult *this_00;
  undefined1 local_40 [8];
  string xml_element;
  
  psVar1 = &xml_element._M_string_length;
  xml_element._M_dataplus._M_p = (pointer)0x0;
  xml_element._M_string_length._0_1_ = 0;
  local_40 = (undefined1  [8])psVar1;
  if (this->current_test_info_ == (TestInfo *)0x0) {
    if (this->current_test_case_ == (TestCase *)0x0) {
      std::__cxx11::string::_M_replace((ulong)local_40,0,(char *)0x0,0x13dc25);
      this_00 = &this->ad_hoc_test_result_;
    }
    else {
      std::__cxx11::string::_M_replace((ulong)local_40,0,(char *)0x0,0x13dc02);
      this_00 = &this->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)local_40,0,(char *)0x0,0x13db7f);
    this_00 = &this->current_test_info_->result_;
  }
  TestResult::RecordProperty(this_00,(string *)local_40,test_property);
  if (local_40 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_40,
                    CONCAT71(xml_element._M_string_length._1_7_,
                             (undefined1)xml_element._M_string_length) + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != NULL) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_case_ != NULL) {
    xml_element = "testsuite";
    test_result = &(current_test_case_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}